

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_chart_push_column(nk_context *ctx,nk_window *win,nk_chart *chart,float value,int slot)

{
  float *pfVar1;
  nk_panel *pnVar2;
  nk_rect rect;
  uint uVar3;
  bool bVar4;
  float local_8c;
  float local_80;
  float local_78;
  float local_70;
  float fStack_64;
  float padding;
  nk_rect item;
  nk_color color;
  nk_flags ret;
  float ratio;
  nk_panel *layout;
  nk_input *in;
  nk_command_buffer *out;
  int slot_local;
  float value_local;
  nk_chart *chart_local;
  nk_window *win_local;
  nk_context *ctx_local;
  
  pnVar2 = win->layout;
  item.h = 0.0;
  memset(&fStack_64,0,0x10);
  if ((-1 < slot) && (slot < 4)) {
    if (chart->slots[slot].index < chart->slots[slot].count) {
      if (chart->slots[slot].count != 0) {
        item.x = (chart->w - (float)(chart->slots[slot].count + -1)) /
                 (float)chart->slots[slot].count;
      }
      item.w = *(float *)&chart->slots[slot].color;
      if (0.0 <= value / chart->slots[slot].range) {
        local_70 = value / chart->slots[slot].range;
      }
      else {
        local_70 = -(value / chart->slots[slot].range);
      }
      item.y = chart->h * local_70;
      if (value < 0.0) {
        local_8c = (value - chart->slots[slot].max) / chart->slots[slot].range;
        if (local_8c < 0.0) {
          local_8c = -local_8c;
        }
        padding = (chart->h * local_8c + chart->y) - item.y;
      }
      else {
        pfVar1 = &chart->slots[slot].min;
        if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
          local_78 = chart->slots[slot].min;
        }
        else {
          local_78 = -chart->slots[slot].min;
        }
        pfVar1 = &chart->slots[slot].range;
        if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
          local_80 = chart->slots[slot].range;
        }
        else {
          local_80 = -chart->slots[slot].range;
        }
        padding = -chart->h * ((value + local_78) / local_80) + chart->y + chart->h;
      }
      fStack_64 = (float)chart->slots[slot].index * item.x + chart->x +
                  (float)chart->slots[slot].index;
      if (((((pnVar2->flags & 0x1000) == 0) && (fStack_64 <= (ctx->input).mouse.pos.x)) &&
          ((ctx->input).mouse.pos.x < fStack_64 + item.x)) &&
         ((padding <= (ctx->input).mouse.pos.y && ((ctx->input).mouse.pos.y < padding + item.y)))) {
        bVar4 = false;
        if ((ctx->input).mouse.buttons[0].down == 0) {
          bVar4 = (ctx->input).mouse.buttons[0].clicked != 0;
        }
        uVar3 = 0;
        if (bVar4) {
          uVar3 = 2;
        }
        item.h = (float)(uVar3 | 1);
        item.w = *(float *)&chart->slots[slot].highlight;
      }
      rect.y = padding;
      rect.x = fStack_64;
      rect.w = item.x;
      rect.h = item.y;
      nk_fill_rect(&win->buffer,rect,0.0,(nk_color)item.w);
      chart->slots[slot].index = chart->slots[slot].index + 1;
      ctx_local._4_4_ = item.h;
    }
    else {
      ctx_local._4_4_ = 0.0;
    }
    return (nk_flags)ctx_local._4_4_;
  }
  __assert_fail("slot >= 0 && slot < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x5e92,
                "nk_flags nk_chart_push_column(const struct nk_context *, struct nk_window *, struct nk_chart *, float, int)"
               );
}

Assistant:

NK_INTERN nk_flags
nk_chart_push_column(const struct nk_context *ctx, struct nk_window *win,
    struct nk_chart *chart, float value, int slot)
{
    struct nk_command_buffer *out = &win->buffer;
    const struct nk_input *in = &ctx->input;
    struct nk_panel *layout = win->layout;

    float ratio;
    nk_flags ret = 0;
    struct nk_color color;
    struct nk_rect item = {0,0,0,0};

    NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
    if (chart->slots[slot].index  >= chart->slots[slot].count)
        return nk_false;
    if (chart->slots[slot].count) {
        float padding = (float)(chart->slots[slot].count-1);
        item.w = (chart->w - padding) / (float)(chart->slots[slot].count);
    }

    /* calculate bounds of current bar chart entry */
    color = chart->slots[slot].color;;
    item.h = chart->h * NK_ABS((value/chart->slots[slot].range));
    if (value >= 0) {
        ratio = (value + NK_ABS(chart->slots[slot].min)) / NK_ABS(chart->slots[slot].range);
        item.y = (chart->y + chart->h) - chart->h * ratio;
    } else {
        ratio = (value - chart->slots[slot].max) / chart->slots[slot].range;
        item.y = chart->y + (chart->h * NK_ABS(ratio)) - item.h;
    }
    item.x = chart->x + ((float)chart->slots[slot].index * item.w);
    item.x = item.x + ((float)chart->slots[slot].index);

    /* user chart bar selection */
    if (!(layout->flags & NK_WINDOW_ROM) &&
        NK_INBOX(in->mouse.pos.x,in->mouse.pos.y,item.x,item.y,item.w,item.h)) {
        ret = NK_CHART_HOVERING;
        ret |= (!in->mouse.buttons[NK_BUTTON_LEFT].down &&
                in->mouse.buttons[NK_BUTTON_LEFT].clicked) ? NK_CHART_CLICKED: 0;
        color = chart->slots[slot].highlight;
    }
    nk_fill_rect(out, item, 0, color);
    chart->slots[slot].index += 1;
    return ret;
}